

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

void QConcatenable<QStringBuilder<QStringBuilder<ProString_&,_QString_&>,_ProString_&>_>::
     appendTo<QChar>(type *p,QChar **out)

{
  ProString *pPVar1;
  QString *pQVar2;
  CutResult CVar3;
  char16_t *pcVar4;
  char16_t *pcVar5;
  long lVar6;
  long lVar7;
  QChar *__dest;
  long in_FS_OFFSET;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar1 = (p->a).a;
  lVar6 = (long)pPVar1->m_length;
  __dest = *out;
  if (lVar6 != 0) {
    pcVar4 = (pPVar1->m_string).d.ptr;
    local_40 = (long)pPVar1->m_offset;
    local_48 = lVar6;
    CVar3 = QtPrivate::QContainerImplHelper::mid((pPVar1->m_string).d.size,&local_40,&local_48);
    pcVar5 = (char16_t *)0x0;
    if (CVar3 != Null) {
      pcVar5 = pcVar4 + local_40;
    }
    memcpy(__dest,pcVar5,lVar6 * 2);
    __dest = *out + lVar6;
    *out = __dest;
  }
  pQVar2 = (p->a).b;
  lVar6 = (pQVar2->d).size;
  if (lVar6 != 0) {
    pcVar4 = (pQVar2->d).ptr;
    if (pcVar4 == (char16_t *)0x0) {
      pcVar4 = (char16_t *)&QString::_empty;
    }
    memcpy(__dest,pcVar4,lVar6 * 2);
    __dest = *out;
  }
  *out = __dest + lVar6;
  pPVar1 = p->b;
  lVar7 = (long)pPVar1->m_length;
  if (lVar7 != 0) {
    pcVar4 = (pPVar1->m_string).d.ptr;
    local_40 = (long)pPVar1->m_offset;
    local_48 = lVar7;
    CVar3 = QtPrivate::QContainerImplHelper::mid((pPVar1->m_string).d.size,&local_40,&local_48);
    pcVar5 = (char16_t *)0x0;
    if (CVar3 != Null) {
      pcVar5 = pcVar4 + local_40;
    }
    memcpy(__dest + lVar6,pcVar5,lVar7 * 2);
    *out = *out + lVar7;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }